

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

int foldconstants(optype intopcode,addressrec a,addressrec b,addressrec c)

{
  datatype dVar1;
  int iVar2;
  
  dVar1 = data_class(b.opnd);
  if (dVar1 == dtreal) {
    iVar2 = foldrconstants(intopcode,a,b,c);
  }
  else {
    iVar2 = foldiconstants(intopcode,a,b,c);
  }
  didcalculation = 1;
  return iVar2;
}

Assistant:

int	foldconstants(enum optype intopcode, struct addressrec a,
                  struct addressrec b, struct addressrec c)
{
    int	nextop;
    
    if (data_class(b.opnd) == dtreal)
        nextop = foldrconstants(intopcode, a, b, c);
    else
        nextop = foldiconstants(intopcode, a, b, c);
    didcalculation = YES;
    return(nextop);
}